

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O1

void cfl_subsample_lbd_420_32x16_ssse3(uint8_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  short *psVar1;
  undefined1 auVar2 [16];
  __m128i *pred_buf_m128i;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar2 = _DAT_00517c80;
  pauVar4 = (undefined1 (*) [16])(cfl_type + 0x10);
  uVar3 = 0xffffffffffffffc0;
  do {
    auVar5 = pmaddubsw(pauVar4[-1],auVar2);
    auVar6 = pmaddubsw(*(undefined1 (*) [16])(pauVar4[-1] + input_stride),auVar2);
    psVar1 = (short *)((long)output_q3 + uVar3 + 0x40);
    *psVar1 = auVar6._0_2_ + auVar5._0_2_;
    psVar1[1] = auVar6._2_2_ + auVar5._2_2_;
    psVar1[2] = auVar6._4_2_ + auVar5._4_2_;
    psVar1[3] = auVar6._6_2_ + auVar5._6_2_;
    psVar1[4] = auVar6._8_2_ + auVar5._8_2_;
    psVar1[5] = auVar6._10_2_ + auVar5._10_2_;
    psVar1[6] = auVar6._12_2_ + auVar5._12_2_;
    psVar1[7] = auVar6._14_2_ + auVar5._14_2_;
    auVar5 = pmaddubsw(*pauVar4,auVar2);
    auVar6 = pmaddubsw(*(undefined1 (*) [16])(*pauVar4 + input_stride),auVar2);
    psVar1 = (short *)((long)output_q3 + uVar3 + 0x50);
    *psVar1 = auVar6._0_2_ + auVar5._0_2_;
    psVar1[1] = auVar6._2_2_ + auVar5._2_2_;
    psVar1[2] = auVar6._4_2_ + auVar5._4_2_;
    psVar1[3] = auVar6._6_2_ + auVar5._6_2_;
    psVar1[4] = auVar6._8_2_ + auVar5._8_2_;
    psVar1[5] = auVar6._10_2_ + auVar5._10_2_;
    psVar1[6] = auVar6._12_2_ + auVar5._12_2_;
    psVar1[7] = auVar6._14_2_ + auVar5._14_2_;
    uVar3 = uVar3 + 0x40;
    pauVar4 = (undefined1 (*) [16])(*pauVar4 + input_stride * 2);
  } while (uVar3 < 0x1c0);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_lbd_ssse3(const uint8_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const __m128i twos = _mm_set1_epi8(2);
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + (height >> 1) * CFL_BUF_LINE_I128;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      __m128i top = _mm_loadh_epi32((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadh_epi32((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeh_epi32(pred_buf_m128i, sum);
    } else if (width == 8) {
      __m128i top = _mm_loadl_epi64((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storel_epi64(pred_buf_m128i, sum);
    } else {
      __m128i top = _mm_loadu_si128((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeu_si128(pred_buf_m128i, sum);
      if (width == 32) {
        __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        top_1 = _mm_maddubs_epi16(top_1, twos);
        bot_1 = _mm_maddubs_epi16(bot_1, twos);
        __m128i sum_1 = _mm_add_epi16(top_1, bot_1);
        _mm_storeu_si128(pred_buf_m128i + 1, sum_1);
      }
    }
    input += luma_stride;
    pred_buf_m128i += CFL_BUF_LINE_I128;
  } while (pred_buf_m128i < end);
}